

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O0

void strunescape(char *s)

{
  wchar_t wVar1;
  char *pcVar2;
  char *pcVar3;
  char local_24;
  char local_23;
  undefined1 local_22;
  byte local_21;
  wchar_t result;
  char hex [3];
  _Bool unescapenext;
  char *out;
  char *in;
  char *s_local;
  
  local_21 = 0;
  _result = s;
  out = s;
LAB_0028d790:
  while( true ) {
    if (*out == '\0') {
      *_result = '\0';
      return;
    }
    if ((local_21 & 1) != 0) break;
    if (*out == '\\') {
      local_21 = 1;
      out = out + 1;
    }
    else {
      *_result = *out;
      _result = _result + 1;
      out = out + 1;
    }
  }
  local_21 = 0;
  switch(*out) {
  case '0':
    *_result = '\0';
    _result = _result + 1;
    break;
  default:
    *_result = '\\';
    _result[1] = *out;
    _result = _result + 2;
    break;
  case '\\':
    *_result = '\\';
    _result = _result + 1;
    break;
  case 'a':
    *_result = '\a';
    _result = _result + 1;
    break;
  case 'b':
    *_result = '\b';
    _result = _result + 1;
    break;
  case 'e':
    *_result = '\x1b';
    _result = _result + 1;
    break;
  case 'f':
    *_result = '\f';
    _result = _result + 1;
    break;
  case 'n':
    *_result = '\n';
    _result = _result + 1;
    break;
  case 'r':
    *_result = '\r';
    _result = _result + 1;
    break;
  case 't':
    *_result = '\t';
    _result = _result + 1;
    break;
  case 'v':
    *_result = '\v';
    _result = _result + 1;
    break;
  case 'x':
    if (out[1] == '\0') {
      pcVar2 = _result + 1;
      *_result = '\\';
      _result = _result + 2;
      *pcVar2 = 'x';
      out = out + 1;
    }
    else {
      local_24 = out[1];
      pcVar2 = out + 2;
      if (out[2] != '\0') {
        local_23 = *pcVar2;
        local_22 = 0;
        wVar1 = hex_str_to_int(&local_24);
        if (wVar1 == L'\xffffffff') {
          *_result = '\\';
          _result[1] = 'x';
          pcVar3 = _result + 3;
          _result[2] = local_24;
          _result = _result + 4;
          *pcVar3 = local_23;
        }
        *_result = (char)wVar1;
        _result = _result + 1;
        out = pcVar2;
        break;
      }
      *_result = '\\';
      pcVar3 = _result + 2;
      _result[1] = 'x';
      _result = _result + 3;
      *pcVar3 = local_24;
      out = pcVar2;
    }
    goto LAB_0028d790;
  }
  out = out + 1;
  goto LAB_0028d790;
}

Assistant:

void strunescape(char *s) {
	char *in = s;
	char *out = s;
	bool unescapenext = false;

	while (*in) {
		if (unescapenext) {
			unescapenext = false;

			switch (*in) {
			case '0':
				*out++ = '\0';
				break;
			case 'a':
				*out++ = '\a';
				break;
			case 'b':
				*out++ = '\b';
				break;
			case 't':
				*out++ = '\t';
				break;
			case 'n':
				*out++ = '\n';
				break;
			case 'v':
				*out++ = '\v';
				break;
			case 'f':
				*out++ = '\f';
				break;
			case 'r':
				*out++ = '\r';
				break;
			case '\\':
				*out++ = '\\';
				break;
			case 'e':
				*out++ = '\x1B';
				break;
			case 'x': {
				char hex[3];
				if (*++in == 0) {
					/* Add back the unmodified sequence */
					*out++ = '\\';
					*out++ = 'x';
					continue;
				}
				hex[0] = *in;
				if (*++in == 0) {
					/* Add back the unmodified sequence */
					*out++ = '\\';
					*out++ = 'x';
					*out++ = hex[0];
					continue;
				}
				hex[1] = *in;
				hex[2] = 0;
				int result = hex_str_to_int(hex);
				if (result == -1) {
					/* Add back the unmodified sequence */
					*out++ = '\\';
					*out++ = 'x';
					*out++ = hex[0];
					*out++ = hex[1];
				}
				*out++ = result;
				break;
				}
			default:
				/* Add back the unmodified sequence */
				*out++ = '\\';
				*out++ = *in;
				break;
			}

			in++;
			continue;
		}

		if (*in == '\\') {
			unescapenext = true;
			in++;
			continue;
		}

		*out++ = *in++;
	}

	*out = 0;
}